

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O2

FxExpression * ParseExpressionJ(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FxExpression *l;
  FxExpression *r;
  FxExpression *this;
  PClassActor *size;
  
  l = ParseExpressionI(sc,cls);
  while( true ) {
    bVar1 = FScanner::CheckToken(sc,0x7c);
    if (!bVar1) break;
    size = cls;
    r = ParseExpressionI(sc,cls);
    this = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)size);
    FxBitOp::FxBitOp((FxBitOp *)this,0x7c,l,r);
    l = this;
  }
  return l;
}

Assistant:

static FxExpression *ParseExpressionJ (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionI (sc, cls);

	while (sc.CheckToken('|'))
	{
		FxExpression *right = ParseExpressionI (sc, cls);
		tmp = new FxBitOp('|', tmp, right);
	}
	return tmp;
}